

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed-fstream.h
# Opt level: O3

void __thiscall
cnn::compressed_ifstream::compressed_ifstream(compressed_ifstream *this,string *fname)

{
  undefined1 *this_00;
  int iVar1;
  long lVar2;
  string suf;
  bool local_101 [9];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  basic_gzip_decompressor<std::allocator<char>_> local_d8;
  
  std::ios_base::ios_base((ios_base *)&this->field_0x278);
  *(undefined8 *)&this->field_0x350 = 0;
  *(undefined2 *)&this->field_0x358 = 0;
  *(undefined8 *)&this->field_0x360 = 0;
  *(undefined8 *)&this->field_0x368 = 0;
  *(undefined8 *)&this->field_0x370 = 0;
  *(undefined8 *)&this->field_0x378 = 0;
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x2fef48;
  *(undefined8 *)&this->field_0x278 = 0x2fef70;
  local_101[1] = true;
  local_101[2] = true;
  local_101[3] = true;
  local_101[4] = false;
  local_101[5] = false;
  local_101[6] = false;
  local_101[7] = false;
  local_101[8] = false;
  (this->super_istream)._M_gcount = 0;
  std::ios::init((streambuf *)&this->field_0x278);
  this_00 = &(this->super_istream).field_0x10;
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x2feef8;
  *(undefined8 *)&this->field_0x278 = 0x2fef20;
  std::ifstream::ifstream(this_00,(fname->_M_dataplus)._M_p,_S_in);
  boost::iostreams::detail::
  chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
  ::chainbuf(&(this->inbuf).
              super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
            );
  *(undefined ***)
   &(this->inbuf).
    super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
       = &PTR__filtering_streambuf_002fefa8;
  (this->inbuf).
  super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
  .
  super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_chain_client = (_func_int **)&DAT_002ff028;
  lVar2 = std::__cxx11::string::rfind((char)fname,0x2e);
  if (0xfffffffffffffffd < lVar2 - 1U) goto LAB_0019857a;
  std::__cxx11::string::substr((ulong)local_f8,(ulong)fname);
  iVar1 = std::__cxx11::string::compare((char *)local_f8);
  if (iVar1 == 0) {
    boost::iostreams::basic_gzip_decompressor<std::allocator<char>_>::basic_gzip_decompressor
              (&local_d8,0xf,0x1000);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::push_impl<boost::iostreams::basic_gzip_decompressor<std::allocator<char>>>
              ((chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                *)(this->inbuf).
                  super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
                  .
                  super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .
                  super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super_chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .chain_,&local_d8,-1,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.putback_._M_dataplus._M_p != &local_d8.putback_.field_2) {
      operator_delete(local_d8.putback_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.header_.comment_._M_dataplus._M_p != &local_d8.header_.comment_.field_2) {
      operator_delete(local_d8.header_.comment_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.header_.file_name_._M_dataplus._M_p != &local_d8.header_.file_name_.field_2) {
      operator_delete(local_d8.header_.file_name_._M_dataplus._M_p);
    }
LAB_0019855d:
    boost::detail::shared_count::~shared_count
              (&local_d8.super_basic_zlib_decompressor<std::allocator<char>_>.
                super_symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
                .pimpl_.pn);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_f8);
    if (iVar1 == 0) {
      local_101[0] = false;
      boost::iostreams::
      symmetric_filter<boost::iostreams::detail::bzip2_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
      ::symmetric_filter<bool>
                ((symmetric_filter<boost::iostreams::detail::bzip2_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
                  *)&local_d8,0x1000,local_101);
      boost::iostreams::detail::
      chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
      ::push_impl<boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>>
                ((chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  *)(this->inbuf).
                    super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
                    .
                    super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super_chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .chain_,(basic_bzip2_decompressor<std::allocator<char>_> *)&local_d8,-1,-1);
      goto LAB_0019855d;
    }
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
LAB_0019857a:
  local_d8.super_basic_zlib_decompressor<std::allocator<char>_>.
  super_symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
  .pimpl_.px = (element_type *)this_00;
  boost::iostreams::detail::
  chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  ::push_impl<boost::iostreams::detail::mode_adapter<boost::iostreams::input,std::istream>>
            ((chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              *)(this->inbuf).
                super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
                .
                super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super_chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                .chain_,
             (mode_adapter<boost::iostreams::input,_std::basic_istream<char,_std::char_traits<char>_>_>
              *)&local_d8,-1,-1);
  return;
}

Assistant:

compressed_ifstream(const std::string& fname) : std::istream(&inbuf), file(fname.c_str()) {
    std::size_t pos = fname.rfind('.');
    if (pos != std::string::npos && pos > 0) {
      const std::string suf = fname.substr(pos + 1);
      if (suf == "gz") {
        inbuf.push(boost::iostreams::gzip_decompressor());
      }
      else if (suf == "bz2")
        inbuf.push(boost::iostreams::bzip2_decompressor());
    }
    inbuf.push(file);
  }